

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

char * SDL_VideoDriverName(char *namebuf,int maxlen)

{
  char *pcVar1;
  
  pcVar1 = (*SDL20_GetCurrentVideoDriver)();
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else if (namebuf != (char *)0x0) {
    (*SDL20_strlcpy)(namebuf,pcVar1,(long)maxlen);
    pcVar1 = namebuf;
  }
  return pcVar1;
}

Assistant:

DECLSPEC12 const char * SDLCALL
SDL_VideoDriverName(char *namebuf, int maxlen)
{
#ifdef __WINDOWS__
    const char *val = SDL20_getenv("SDL_VIDEODRIVER");
    if (val) {
        /* give them back what they requested: */
        if (SDL20_strcmp(val,  "windib") == 0  ||
            SDL20_strcmp(val, "directx") == 0) {
            return GetDriverName(val, namebuf, maxlen);
        }
    }
    val = SDL20_GetCurrentVideoDriver();
    if (val && SDL20_strcmp(val, "windows") == 0) {
        /* Windows apps may use SDL_VideoDriverName() to check accelerated
         * vs unaccelerated display by using directx and windib.
         * https://github.com/libsdl-org/sdl12-compat/issues/223 */
        val = "directx";
    }
    return GetDriverName(val, namebuf, maxlen);
#else
    return GetDriverName(SDL20_GetCurrentVideoDriver(), namebuf, maxlen);
#endif
}